

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::GetArrayOfNonStruct
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  size_t sVar1;
  string local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  string local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  Type local_3c0;
  string local_3a0;
  string local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  string local_340;
  string local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  string local_2c0;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  Type local_1a0;
  string local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_50;
  string *local_30;
  string *code;
  string *code_ptr_local;
  FieldDef *field_local;
  StructDef *struct_def_local;
  PythonGenerator *this_local;
  
  local_30 = code_ptr;
  code = code_ptr;
  code_ptr_local = (string *)field;
  field_local = (FieldDef *)struct_def;
  struct_def_local = (StructDef *)this;
  GenReceiver(this,struct_def,code_ptr);
  Namer::Method<flatbuffers::FieldDef>
            (&local_50,&(this->namer_).super_Namer,(FieldDef *)code_ptr_local);
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::operator+=((string *)local_30,"(self, j = None):");
  GenIndents_abi_cxx11_(&local_a0,this,2);
  std::operator+(&local_80,&local_a0,"if j is None:");
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  GenIndents_abi_cxx11_(&local_100,this,3);
  std::operator+(&local_e0,&local_100,"return [");
  GenGetter_abi_cxx11_(&local_120,this,(Type *)&code_ptr_local[6]._M_string_length);
  std::operator+(&local_c0,&local_e0,&local_120);
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::operator+=
            ((string *)local_30,"self._tab.Pos + flatbuffers.number_types.UOffsetTFlags.py_type(");
  NumToString<unsigned_short>(&local_160,(unsigned_short)code_ptr_local[8]._M_string_length);
  std::operator+(&local_140,&local_160," + i * ");
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  Type::VectorType(&local_1a0,(Type *)&code_ptr_local[6]._M_string_length);
  sVar1 = InlineSize(&local_1a0);
  NumToString<unsigned_long>(&local_180,sVar1);
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::operator+=((string *)local_30,")) for i in range(");
  Namer::Method<flatbuffers::FieldDef>
            (&local_220,&(this->namer_).super_Namer,(FieldDef *)code_ptr_local);
  std::operator+(&local_200,"self.",&local_220);
  std::operator+(&local_1e0,&local_200,"Length()");
  std::operator+(&local_1c0,&local_1e0,")]");
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  GenIndents_abi_cxx11_(&local_2a0,this,2);
  std::operator+(&local_280,&local_2a0,"elif j >= 0 and j < self.");
  Namer::Method<flatbuffers::FieldDef>
            (&local_2c0,&(this->namer_).super_Namer,(FieldDef *)code_ptr_local);
  std::operator+(&local_260,&local_280,&local_2c0);
  std::operator+(&local_240,&local_260,"Length():");
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  GenIndents_abi_cxx11_(&local_320,this,3);
  std::operator+(&local_300,&local_320,"return ");
  GenGetter_abi_cxx11_(&local_340,this,(Type *)&code_ptr_local[6]._M_string_length);
  std::operator+(&local_2e0,&local_300,&local_340);
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::operator+=
            ((string *)local_30,"self._tab.Pos + flatbuffers.number_types.UOffsetTFlags.py_type(");
  NumToString<unsigned_short>(&local_380,(unsigned_short)code_ptr_local[8]._M_string_length);
  std::operator+(&local_360,&local_380," + j * ");
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_380);
  Type::VectorType(&local_3c0,(Type *)&code_ptr_local[6]._M_string_length);
  sVar1 = InlineSize(&local_3c0);
  NumToString<unsigned_long>(&local_3a0,sVar1);
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::operator+=((string *)local_30,"))");
  GenIndents_abi_cxx11_(&local_400,this,2);
  std::operator+(&local_3e0,&local_400,"else:");
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_400);
  GenIndents_abi_cxx11_(&local_440,this,3);
  std::operator+(&local_420,&local_440,"return None\n\n");
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_420);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)&local_440);
  return;
}

Assistant:

void GetArrayOfNonStruct(const StructDef &struct_def, const FieldDef &field,
                           std::string *code_ptr) const {
    auto &code = *code_ptr;
    GenReceiver(struct_def, code_ptr);
    code += namer_.Method(field);
    code += "(self, j = None):";
    code += GenIndents(2) + "if j is None:";
    code += GenIndents(3) + "return [" + GenGetter(field.value.type);
    code += "self._tab.Pos + flatbuffers.number_types.UOffsetTFlags.py_type(";
    code += NumToString(field.value.offset) + " + i * ";
    code += NumToString(InlineSize(field.value.type.VectorType()));
    code += ")) for i in range(";
    code += "self." + namer_.Method(field) + "Length()" + ")]";
    code += GenIndents(2) + "elif j >= 0 and j < self." + namer_.Method(field) +
            "Length():";
    code += GenIndents(3) + "return " + GenGetter(field.value.type);
    code += "self._tab.Pos + flatbuffers.number_types.UOffsetTFlags.py_type(";
    code += NumToString(field.value.offset) + " + j * ";
    code += NumToString(InlineSize(field.value.type.VectorType()));
    code += "))";
    code += GenIndents(2) + "else:";
    code += GenIndents(3) + "return None\n\n";
  }